

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::SADx3Test_DISABLED_Speed_Test::~SADx3Test_DISABLED_Speed_Test
          (SADx3Test_DISABLED_Speed_Test *this)

{
  *(undefined ***)this = &PTR__CodecTestWith3Params_010d8878;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr((unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                 *)(this + 8));
  return;
}

Assistant:

TEST_P(SADx3Test, DISABLED_Speed) {
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  SpeedSAD();
}